

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tenor.cpp
# Opt level: O1

Tenor * bidfx_public_api::Tenor::GetTenorFromString(string *tenor)

{
  const_iterator cVar1;
  mapped_type *ppTVar2;
  ostream *poVar3;
  invalid_argument *this;
  stringstream ss;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  if (tenor_list__abi_cxx11_._40_8_ == 0) {
    CreateTenorList();
  }
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                  *)tenor_list__abi_cxx11_,tenor);
  if (cVar1._M_node != (_Base_ptr)(tenor_list__abi_cxx11_ + 8)) {
    ppTVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                            *)tenor_list__abi_cxx11_,tenor);
    return *ppTVar2;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Tenor ",6);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,(tenor->_M_dataplus)._M_p,tenor->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," does not exist",0xf);
  std::endl<char,std::char_traits<char>>(poVar3);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this,local_1c0);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

const Tenor& Tenor::GetTenorFromString(const std::string &tenor)
{
    if (tenor_list_.empty())
    {
        CreateTenorList();
    }

    if (tenor_list_.count(tenor))
    {
        return *tenor_list_[tenor];
    }

    std::stringstream ss;
    ss << "Tenor " << tenor << " does not exist" << std::endl;
    throw std::invalid_argument(ss.str());
}